

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testInit(VaryingLocationLimitTest *this)

{
  Type TVar1;
  undefined1 local_6c [8];
  testCase test_case_out;
  testCase test_case_in;
  GLuint stage;
  GLuint local_38;
  undefined8 local_2c;
  GLuint local_24;
  undefined8 *local_20;
  Type *type;
  GLuint i;
  GLuint n_types;
  VaryingLocationLimitTest *this_local;
  
  _i = this;
  type._4_4_ = TestBase::getTypesNumber((TestBase *)this);
  for (type._0_4_ = 0; (uint)type < type._4_4_; type._0_4_ = (uint)type + 1) {
    TVar1 = TestBase::getType((TestBase *)this,(uint)type);
    stack0xffffffffffffffc0 = TVar1._0_8_;
    local_2c = stack0xffffffffffffffc0;
    local_38 = TVar1.m_n_rows;
    local_24 = local_38;
    local_20 = &local_2c;
    for (test_case_in.m_type.m_n_rows = 0; test_case_in.m_type.m_n_rows < 6;
        test_case_in.m_type.m_n_rows = test_case_in.m_type.m_n_rows + 1) {
      if (test_case_in.m_type.m_n_rows != 0) {
        test_case_out.m_type.m_n_rows._0_1_ = 1;
        unique0x00012000 = *local_20;
        local_6c[0] = false;
        unique0x00012000 = *local_20;
        test_case_out.m_type.m_basic_type = *(TYPES *)(local_20 + 1);
        test_case_out.m_type.m_n_columns = test_case_in.m_type.m_n_rows;
        std::
        vector<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>_>
        ::push_back(&this->m_test_cases,(value_type *)&test_case_out.m_type.m_n_rows);
        if (test_case_in.m_type.m_n_rows != 5) {
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)local_6c);
        }
      }
    }
  }
  return;
}

Assistant:

void VaryingLocationLimitTest::testInit()
{
	const GLuint n_types = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type = getType(i);

		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			if (Utils::Shader::COMPUTE == stage)
			{
				continue;
			}

			testCase test_case_in  = { true, type, (Utils::Shader::STAGES)stage };
			testCase test_case_out = { false, type, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case_in);

			if (Utils::Shader::FRAGMENT != stage)
			{
				m_test_cases.push_back(test_case_out);
			}
		}
	}
}